

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::Append
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,TPZFMatrix<double> *u1,
          TPZFMatrix<double> *u2,TPZFMatrix<double> *u12)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t cu1;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t ru1;
  
  lVar8 = (u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar5 = (u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  lVar7 = (u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar1 = (u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar1 == 1 && lVar5 == 1) {
    (*(u12->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (u12,lVar7 + lVar8,1);
    if (0 < lVar8) {
      lVar5 = 0;
      do {
        if (((u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        u12->fElem[lVar5] = u1->fElem[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar8 != lVar5);
    }
    if (0 < lVar7) {
      lVar5 = 0;
      do {
        if (((u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((lVar8 < 0) || ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
           ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        u12->fElem[lVar8] = u2->fElem[lVar5];
        lVar5 = lVar5 + 1;
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  else {
    lVar6 = lVar7;
    if (lVar7 < lVar8) {
      lVar6 = lVar8;
    }
    (*(u12->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (u12,lVar6,lVar1 + lVar5);
    if (0 < lVar8) {
      lVar6 = 0;
      do {
        if (0 < lVar5) {
          lVar4 = 0;
          do {
            lVar2 = (u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar2 <= lVar6) ||
               ((u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar3 = (u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar3 <= lVar6) ||
               ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar4)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            u12->fElem[lVar3 * lVar4 + lVar6] = u1->fElem[lVar2 * lVar4 + lVar6];
            lVar4 = lVar4 + 1;
          } while (lVar5 != lVar4);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar8);
    }
    if (0 < lVar7) {
      lVar8 = 0;
      do {
        if (0 < lVar1) {
          lVar6 = 0;
          do {
            lVar4 = (u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar4 <= lVar8) ||
               ((u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar6)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar2 = lVar6 + lVar5;
            lVar3 = (u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar3 <= lVar8) || (lVar2 < 0)) ||
               ((u12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            u12->fElem[lVar3 * lVar2 + lVar8] = u2->fElem[lVar4 * lVar6 + lVar8];
            lVar6 = lVar6 + 1;
          } while (lVar1 != lVar6);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar7);
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Append(TPZFMatrix<REAL> &u1, TPZFMatrix<REAL> &u2, TPZFMatrix<REAL> &u12)
{

	bool Is_u1PHI = (u1.Cols() == 1) ? true : false;
	bool Is_u2PHI = (u2.Cols() == 1) ? true : false;

	if(Is_u1PHI && Is_u2PHI)
	{
		int64_t nu1 = u1.Rows(),nu2 = u2.Rows();
		u12.Redim(nu1+nu2,1);
		int64_t i;
		for(i=0; i<nu1; i++) u12(i,0) = u1(i,0);
		for(i=0; i<nu2; i++) u12(i+nu1,0) = u2(i,0);


	}
	else if(!Is_u1PHI || !Is_u2PHI)
	{
		int64_t ru1 = u1.Rows(), cu1 = u1.Cols(), ru2 = u2.Rows(), cu2 = u2.Cols();
		int64_t ru12 = ru1 < ru2 ? ru2 : ru1;
		int64_t cu12 = cu1+cu2;
		u12.Redim(ru12,cu12);
		int64_t i,j;
		for(i=0; i<ru1; i++) for(j=0; j<cu1; j++) u12(i,j) = u1(i,j);
		for(i=0; i<ru2; i++) for(j=0; j<cu2; j++) u12(i,j+cu1) = u2(i,j);
	}
	else
	{
		PZError << "TPZCompElHDiv::Append. Bad input parameters " << std::endl;

	}

}